

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_signature_normalize
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sigout,
              secp256k1_ecdsa_signature *sigin)

{
  uint uVar1;
  undefined8 in_RAX;
  bool bVar2;
  secp256k1_scalar s;
  secp256k1_scalar r;
  undefined8 local_28;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_signature_normalize_cold_2();
  }
  else if (sigin != (secp256k1_ecdsa_signature *)0x0) {
    local_28 = in_RAX;
    secp256k1_scalar_set_b32((secp256k1_scalar *)((long)&local_28 + 4),sigin->data,(int *)0x0);
    secp256k1_scalar_set_b32((secp256k1_scalar *)&local_28,sigin->data + 0x20,(int *)0x0);
    secp256k1_scalar_verify((secp256k1_scalar *)&local_28);
    uVar1 = (uint)local_28;
    bVar2 = 6 < (uint)local_28;
    if (sigout == (secp256k1_ecdsa_signature *)0x0) {
      return (uint)bVar2;
    }
    if (6 < (uint)local_28) {
      secp256k1_scalar_verify((secp256k1_scalar *)&local_28);
      local_28 = CONCAT44(local_28._4_4_,0xd - uVar1);
      secp256k1_scalar_verify((secp256k1_scalar *)&local_28);
    }
    secp256k1_ecdsa_signature_save
              (sigout,(secp256k1_scalar *)((long)&local_28 + 4),(secp256k1_scalar *)&local_28);
    return (uint)bVar2;
  }
  secp256k1_ecdsa_signature_normalize_cold_1();
  return 0;
}

Assistant:

int secp256k1_ecdsa_signature_normalize(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sigout, const secp256k1_ecdsa_signature *sigin) {
    secp256k1_scalar r, s;
    int ret = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sigin != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sigin);
    ret = secp256k1_scalar_is_high(&s);
    if (sigout != NULL) {
        if (ret) {
            secp256k1_scalar_negate(&s, &s);
        }
        secp256k1_ecdsa_signature_save(sigout, &r, &s);
    }

    return ret;
}